

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall Protocol::MQTT::V5::WillMessage::copyInto(WillMessage *this,uint8 *buffer)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 o;
  uint8 *buffer_local;
  WillMessage *this_local;
  
  uVar1 = Properties::copyInto(&this->willProperties,buffer);
  uVar2 = Common::DynamicString::copyInto(&this->willTopic,buffer + uVar1);
  uVar3 = Common::DynamicBinaryData::copyInto(&this->willPayload,buffer + (uVar2 + uVar1));
  return uVar3 + uVar2 + uVar1;
}

Assistant:

virtual uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = willProperties.copyInto(buffer);
                    o += willTopic.copyInto(buffer+o);
                    o += willPayload.copyInto(buffer+o);
                    return o;
                }